

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void google::protobuf::SetField
               (uint64 val,FieldDescriptor *field,Message *msg,Reflection *reflection)

{
  Type TVar1;
  LogMessage *pLVar2;
  float value;
  LogFinisher local_59;
  LogMessage local_58;
  
  TVar1 = FieldDescriptor::type(field);
  value = (float)val;
  switch(TVar1) {
  case TYPE_DOUBLE:
    break;
  case TYPE_FLOAT:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddFloat(reflection,msg,field,value);
      return;
    }
    Reflection::SetFloat(reflection,msg,field,value);
    return;
  case TYPE_UINT64:
  case TYPE_FIXED64:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt64(reflection,msg,field,val);
      return;
    }
    Reflection::SetUInt64(reflection,msg,field,val);
    return;
  case TYPE_FIXED32:
  case TYPE_UINT32:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt32(reflection,msg,field,(uint32)value);
      return;
    }
    Reflection::SetUInt32(reflection,msg,field,(uint32)value);
    return;
  case TYPE_BOOL:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddBool(reflection,msg,field,val != 0);
      return;
    }
    Reflection::SetBool(reflection,msg,field,val != 0);
    return;
  default:
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
               ,0xe4);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_58,"Error in descriptors, primitve field with field type ");
    TVar1 = FieldDescriptor::type(field);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,TVar1);
    internal::LogFinisher::operator=(&local_59,pLVar2);
    internal::LogMessage::~LogMessage(&local_58);
    return;
  case TYPE_ENUM:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddEnumValue(reflection,msg,field,(int)value);
      return;
    }
    Reflection::SetEnumValue(reflection,msg,field,(int)value);
    return;
  case TYPE_SINT32:
    val = (uint64)(-((uint)value & 1) ^ (uint)(val >> 1) & 0x7fffffff);
  case TYPE_INT32:
  case TYPE_SFIXED32:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt32(reflection,msg,field,(int32)val);
      return;
    }
    Reflection::SetInt32(reflection,msg,field,(int32)val);
    return;
  case MAX_TYPE:
    val = -(ulong)((uint)value & 1) ^ val >> 1;
  case TYPE_INT64:
  case TYPE_SFIXED64:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt64(reflection,msg,field,val);
      return;
    }
    Reflection::SetInt64(reflection,msg,field,val);
    return;
  }
  if (*(int *)(field + 0x3c) == 3) {
    Reflection::AddDouble(reflection,msg,field,(double)val);
    return;
  }
  Reflection::SetDouble(reflection,msg,field,(double)val);
  return;
}

Assistant:

void SetField(uint64 val, const FieldDescriptor* field, Message* msg,
              const Reflection* reflection) {
#define STORE_TYPE(CPPTYPE_METHOD)                        \
  do                                                      \
    if (field->is_repeated()) {                           \
      reflection->Add##CPPTYPE_METHOD(msg, field, value); \
    } else {                                              \
      reflection->Set##CPPTYPE_METHOD(msg, field, value); \
    }                                                     \
  while (0)

  switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD) \
  case FieldDescriptor::TYPE_##TYPE: {             \
    CPPTYPE value = val;                           \
    STORE_TYPE(CPPTYPE_METHOD);                    \
    break;                                         \
  }

    // Varints
    HANDLE_TYPE(INT32, int32, Int32)
    HANDLE_TYPE(INT64, int64, Int64)
    HANDLE_TYPE(UINT32, uint32, UInt32)
    HANDLE_TYPE(UINT64, uint64, UInt64)
    case FieldDescriptor::TYPE_SINT32: {
      int32 value = WireFormatLite::ZigZagDecode32(val);
      STORE_TYPE(Int32);
      break;
    }
    case FieldDescriptor::TYPE_SINT64: {
      int64 value = WireFormatLite::ZigZagDecode64(val);
      STORE_TYPE(Int64);
      break;
    }
      HANDLE_TYPE(BOOL, bool, Bool)

      // Fixed
      HANDLE_TYPE(FIXED32, uint32, UInt32)
      HANDLE_TYPE(FIXED64, uint64, UInt64)
      HANDLE_TYPE(SFIXED32, int32, Int32)
      HANDLE_TYPE(SFIXED64, int64, Int64)

    case FieldDescriptor::TYPE_FLOAT: {
      float value;
      uint32 bit_rep = val;
      std::memcpy(&value, &bit_rep, sizeof(value));
      STORE_TYPE(Float);
      break;
    }
    case FieldDescriptor::TYPE_DOUBLE: {
      double value;
      uint64 bit_rep = val;
      std::memcpy(&value, &bit_rep, sizeof(value));
      STORE_TYPE(Double);
      break;
    }
    case FieldDescriptor::TYPE_ENUM: {
      int value = val;
      if (field->is_repeated()) {
        reflection->AddEnumValue(msg, field, value);
      } else {
        reflection->SetEnumValue(msg, field, value);
      }
      break;
    }
    default:
      GOOGLE_LOG(FATAL) << "Error in descriptors, primitve field with field type "
                 << field->type();
  }
#undef STORE_TYPE
#undef HANDLE_TYPE
}